

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall
ClipperLib::ClipperBase::PopLocalMinima(ClipperBase *this,cInt Y,LocalMinimum **locMin)

{
  bool bVar1;
  reference pLVar2;
  bool bVar3;
  __normal_iterator<ClipperLib::LocalMinimum_*,_std::vector<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>_>
  local_30;
  LocalMinimum **local_28;
  LocalMinimum **locMin_local;
  cInt Y_local;
  ClipperBase *this_local;
  
  local_28 = locMin;
  locMin_local = (LocalMinimum **)Y;
  Y_local = (cInt)this;
  local_30._M_current =
       (LocalMinimum *)
       std::vector<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>::end
                 (&this->m_MinimaList);
  bVar1 = __gnu_cxx::operator==(&this->m_CurrentLM,&local_30);
  bVar3 = true;
  if (!bVar1) {
    pLVar2 = __gnu_cxx::
             __normal_iterator<ClipperLib::LocalMinimum_*,_std::vector<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>_>
             ::operator*(&this->m_CurrentLM);
    bVar3 = (LocalMinimum **)pLVar2->Y != locMin_local;
  }
  if (!bVar3) {
    pLVar2 = __gnu_cxx::
             __normal_iterator<ClipperLib::LocalMinimum_*,_std::vector<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>_>
             ::operator*(&this->m_CurrentLM);
    *local_28 = pLVar2;
    __gnu_cxx::
    __normal_iterator<ClipperLib::LocalMinimum_*,_std::vector<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>_>
    ::operator++(&this->m_CurrentLM);
  }
  this_local._7_1_ = !bVar3;
  return this_local._7_1_;
}

Assistant:

bool ClipperBase::PopLocalMinima(cInt Y, const LocalMinimum *&locMin)
{
  if (m_CurrentLM == m_MinimaList.end() || (*m_CurrentLM).Y != Y) return false;
  locMin = &(*m_CurrentLM);
  ++m_CurrentLM;
  return true;
}